

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UBool __thiscall icu_63::FCDUTF8CollationIterator::nextHasLccc(FCDUTF8CollationIterator *this)

{
  int iVar1;
  byte bVar2;
  UBool UVar3;
  int iVar4;
  byte local_21;
  int local_20;
  uint uStack_1c;
  uint8_t __t;
  int32_t i;
  UChar32 c;
  FCDUTF8CollationIterator *this_local;
  
  bVar2 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos];
  if ((bVar2 < 0xcc) || (((0xe3 < bVar2 && (bVar2 < 0xee)) && (bVar2 != 0xea)))) {
    return '\0';
  }
  iVar1 = (this->super_UTF8CollationIterator).pos;
  local_20 = iVar1 + 1;
  bVar2 = (this->super_UTF8CollationIterator).u8[iVar1];
  uStack_1c = (uint)bVar2;
  if ((bVar2 & 0x80) == 0) goto LAB_00278951;
  if (local_20 != (this->super_UTF8CollationIterator).length) {
    if (uStack_1c < 0xe0) {
      if (0xc1 < uStack_1c) {
        uStack_1c = uStack_1c & 0x1f;
LAB_00278903:
        bVar2 = (this->super_UTF8CollationIterator).u8[local_20] + 0x80;
        if (bVar2 < 0x40) {
          uStack_1c = uStack_1c << 6 | (uint)bVar2;
          goto LAB_00278951;
        }
      }
    }
    else if (uStack_1c < 0xf0) {
      uStack_1c = uStack_1c & 0xf;
      local_21 = (this->super_UTF8CollationIterator).u8[local_20];
      if (((int)" 000000000000\x1000"[(int)uStack_1c] & 1 << (sbyte)((int)(uint)local_21 >> 5)) != 0
         ) {
        local_21 = local_21 & 0x3f;
LAB_002788c3:
        uStack_1c = uStack_1c << 6 | (uint)local_21;
        local_20 = local_20 + 1;
        if (local_20 != (this->super_UTF8CollationIterator).length) goto LAB_00278903;
      }
    }
    else {
      iVar4 = uStack_1c - 0xf0;
      if ((iVar4 < 5) &&
         (bVar2 = (this->super_UTF8CollationIterator).u8[local_20],
         ((int)""[(int)(uint)bVar2 >> 4] & 1 << ((byte)iVar4 & 0x1f)) != 0)) {
        uStack_1c = iVar4 * 0x40 | bVar2 & 0x3f;
        local_20 = iVar1 + 2;
        if ((local_20 != (this->super_UTF8CollationIterator).length) &&
           (local_21 = (this->super_UTF8CollationIterator).u8[local_20] + 0x80, local_21 < 0x40))
        goto LAB_002788c3;
      }
    }
  }
  uStack_1c = 0xfffd;
LAB_00278951:
  if (0xffff < (int)uStack_1c) {
    uStack_1c = ((int)uStack_1c >> 10) + 0xd7c0U & 0xffff;
  }
  UVar3 = CollationFCD::hasLccc(uStack_1c);
  return UVar3;
}

Assistant:

UBool
FCDUTF8CollationIterator::nextHasLccc() const {
    U_ASSERT(state == CHECK_FWD && pos != length);
    // The lowest code point with ccc!=0 is U+0300 which is CC 80 in UTF-8.
    // CJK U+4000..U+DFFF except U+Axxx are also FCD-inert. (Lead bytes E4..ED except EA.)
    UChar32 c = u8[pos];
    if(c < 0xcc || (0xe4 <= c && c <= 0xed && c != 0xea)) { return FALSE; }
    int32_t i = pos;
    U8_NEXT_OR_FFFD(u8, i, length, c);
    if(c > 0xffff) { c = U16_LEAD(c); }
    return CollationFCD::hasLccc(c);
}